

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDeferredTestReporter.cpp
# Opt level: O3

void __thiscall
UnitTest::anon_unknown_0::
TestDeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessage::RunImpl
          (TestDeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessage *this)

{
  TestDetails *details;
  DeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessageHelper fixtureHelper;
  DeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessageHelper local_1c8 [2];
  
  details = &(this->super_Test).m_details;
  DeferredTestReporterFixture::DeferredTestReporterFixture
            (&local_1c8[0].super_DeferredTestReporterFixture);
  local_1c8[0].m_details = details;
  ExecuteTest<UnitTest::(anonymous_namespace)::DeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessageHelper>
            (local_1c8,details);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0].super_DeferredTestReporterFixture.fileName._M_dataplus._M_p !=
      &local_1c8[0].super_DeferredTestReporterFixture.fileName.field_2) {
    operator_delete(local_1c8[0].super_DeferredTestReporterFixture.fileName._M_dataplus._M_p,
                    local_1c8[0].super_DeferredTestReporterFixture.fileName.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0].super_DeferredTestReporterFixture.testSuite._M_dataplus._M_p !=
      &local_1c8[0].super_DeferredTestReporterFixture.testSuite.field_2) {
    operator_delete(local_1c8[0].super_DeferredTestReporterFixture.testSuite._M_dataplus._M_p,
                    local_1c8[0].super_DeferredTestReporterFixture.testSuite.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0].super_DeferredTestReporterFixture.testName._M_dataplus._M_p !=
      &local_1c8[0].super_DeferredTestReporterFixture.testName.field_2) {
    operator_delete(local_1c8[0].super_DeferredTestReporterFixture.testName._M_dataplus._M_p,
                    local_1c8[0].super_DeferredTestReporterFixture.testName.field_2.
                    _M_allocated_capacity + 1);
  }
  local_1c8[0].super_DeferredTestReporterFixture.reporter.super_DeferredTestReporter.
  super_TestReporter._vptr_TestReporter = (_func_int **)&PTR__DeferredTestReporter_00152c28;
  std::vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>::~vector
            (&local_1c8[0].super_DeferredTestReporterFixture.reporter.super_DeferredTestReporter.
              m_results);
  TestReporter::~TestReporter((TestReporter *)local_1c8);
  return;
}

Assistant:

TEST_FIXTURE(DeferredTestReporterFixture, DeferredTestReporterTakesCopyOfFailureMessage)
{
    reporter.ReportTestStart(details);

    char failureMessage[128];
    char const* goodStr = "Real failure message";
    char const* badStr = "Bogus failure message";
    
	using namespace std;

    strcpy(failureMessage, goodStr);
    reporter.ReportFailure(details, failureMessage);
    strcpy(failureMessage, badStr);

    DeferredTestResult const& result = reporter.GetResults().at(0);
    DeferredTestResult::Failure const& failure = result.failures.at(0);
    CHECK_EQUAL(goodStr, failure.second);
}